

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSlidingWindowsLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  long lVar1;
  bool bVar2;
  SlidingWindowsLayerParams *pSVar3;
  Type *pTVar4;
  long lVar5;
  string err;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,1);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar2 = Result::good(&r);
  if (bVar2) {
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  pSVar3 = Specification::NeuralNetworkLayer::slidingwindows(layer);
  if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
    lVar5 = (long)(int)pTVar4->rank_;
    lVar1 = pSVar3->axis_;
    if (SBORROW8(lVar1,-lVar5) != lVar1 + lVar5 < 0 || lVar5 <= lVar1) {
      std::operator+(&local_38,
                     "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                     (layer->name_).ptr_);
      std::operator+(&err,&local_38,"\' layer.");
      std::__cxx11::string::~string((string *)&local_38);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      std::__cxx11::string::~string((string *)&err);
      goto LAB_002539f9;
    }
  }
  Result::Result(__return_storage_ptr__,&r);
LAB_002539f9:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSlidingWindowsLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.slidingwindows();
    // axis should be in range [-inputRank : inputRank)
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}